

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::GetSseSum16x16DualTest_MaxMseSum_Test::TestBody
          (GetSseSum16x16DualTest_MaxMseSum_Test *this)

{
  int source_stride;
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  pointer *__ptr;
  long lVar5;
  long lVar6;
  uint *puVar7;
  SEARCH_METHODS *pSVar8;
  uint *sse16x16;
  uint32_t *var16x16;
  long lVar9;
  long lVar10;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4a8;
  AssertHelper local_4a0;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  RegisterStateCheckMMX reg_check_mmx;
  uint var2 [64];
  uint var1 [64];
  uint sse2 [64];
  uint sse1 [64];
  
  memset((this->super_GetSseSum16x16DualTest).src_,0xff,
         (long)(this->super_GetSseSum16x16DualTest).params_.block_size);
  lVar10 = 0;
  memset((this->super_GetSseSum16x16DualTest).ref_,0,
         (long)(this->super_GetSseSum16x16DualTest).params_.block_size);
  memset(sse1,0,0x100);
  memset(sse2,0,0x100);
  memset(var1,0,0x100);
  memset(var2,0,0x100);
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  source_stride = (this->super_GetSseSum16x16DualTest).params_.width;
  lVar5 = 0;
  iVar2 = source_stride;
  for (lVar3 = 0; lVar3 < (this->super_GetSseSum16x16DualTest).params_.height; lVar3 = lVar3 + 0x10)
  {
    lVar5 = (long)(int)lVar5;
    var16x16 = var2 + lVar5;
    sse16x16 = sse2 + lVar5;
    puVar4 = var1 + lVar5;
    puVar7 = sse1 + lVar5;
    lVar9 = lVar10;
    for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 0x20) {
      reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
      reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
      reg_check_mmx.pre_fpu_env_[0] = in_FPUControlWord;
      reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
      (*(this->super_GetSseSum16x16DualTest).params_.func)
                ((this->super_GetSseSum16x16DualTest).src_ + lVar9,source_stride,
                 (this->super_GetSseSum16x16DualTest).ref_ + lVar9,source_stride,puVar7,
                 &sse_tot_simd,&sum_tot_simd,puVar4);
      libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
      aom_get_var_sse_sum_16x16_dual_c
                ((this->super_GetSseSum16x16DualTest).src_ + lVar9,source_stride,
                 (this->super_GetSseSum16x16DualTest).ref_ + lVar9,source_stride,sse16x16,&sse_tot_c
                 ,&sum_tot_c,var16x16);
      lVar5 = lVar5 + 2;
      iVar2 = (this->super_GetSseSum16x16DualTest).params_.width;
      var16x16 = var16x16 + 2;
      sse16x16 = sse16x16 + 2;
      puVar4 = puVar4 + 2;
      puVar7 = puVar7 + 2;
      lVar9 = lVar9 + 0x20;
    }
    lVar10 = lVar10 + (long)source_stride * 0x10;
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&reg_check_mmx,"sse_tot_c","sse_tot_simd",&sse_tot_c,&sse_tot_simd);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_4a8);
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x436,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if (local_4a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4a8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(reg_check_mmx.pre_fpu_env_ + 4));
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&reg_check_mmx,"sum_tot_c","sum_tot_simd",&sum_tot_c,&sum_tot_simd);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_4a8);
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = (SEARCH_METHODS *)*puVar1;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x437,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if (local_4a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_4a8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(reg_check_mmx.pre_fpu_env_ + 4));
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 4) {
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"sse1[p]","sse2[p]",(uint *)((long)sse1 + lVar3),
               (uint *)((long)sse2 + lVar3));
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4a8);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar8 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar8 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x43a,(char *)pSVar8);
      testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      if (local_4a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4a8._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"var1[p]","var2[p]",(uint *)((long)var1 + lVar3),
               (uint *)((long)var2 + lVar3));
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4a8);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar8 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar8 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x43b,(char *)pSVar8);
      testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4a0);
      if (local_4a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4a8._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
  }
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, MaxMseSum) { MaxTestSseSumDual(); }